

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O2

void k054539_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  short *psVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  ulong uVar12;
  long lVar13;
  short sVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  uint uVar20;
  byte bVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint *puVar25;
  size_t __n;
  uint uVar26;
  uint uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  
  auVar10 = _DAT_0016dd10;
  if ((*(byte *)((long)param + 0xb08) & 1) == 0) {
    __n = (ulong)samples << 2;
    memset(*outputs,0,__n);
    memset(outputs[1],0,__n);
    return;
  }
  lVar8 = *(long *)((long)param + 0xb10);
  uVar12 = 0;
  do {
    if (uVar12 == samples) {
      return;
    }
    dVar28 = 0.0;
    if ((*(byte *)((long)param + 0x8d8) & 2) == 0) {
      dVar28 = (double)(int)*(short *)(lVar8 + (ulong)*(ushort *)((long)param + 0xb18) * 2);
    }
    *(undefined2 *)(lVar8 + (ulong)*(ushort *)((long)param + 0xb18) * 2) = 0;
    dVar30 = dVar28;
    for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
      bVar4 = *(byte *)((long)param + 0xb05);
      if (((bVar4 >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
         (*(char *)((long)param + lVar13 + 0xbc0) == '\0')) {
        lVar16 = lVar13 * 0x20;
        bVar21 = *(byte *)((long)param + lVar16 + 0x8dc);
        uVar11 = (uint)*(byte *)((long)param + lVar16 + 0x8dd) + (uint)bVar21;
        if (0xfe < uVar11) {
          uVar11 = 0xff;
        }
        bVar19 = *(byte *)((long)param + lVar16 + 0x8de);
        if ((byte)(bVar19 + 0x7f) < 0xf) {
          uVar20 = bVar19 - 0x81;
        }
        else {
          uVar20 = bVar19 - 0x11;
          if (0xe < (byte)(bVar19 - 0x11)) {
            uVar20 = 7;
          }
        }
        puVar25 = (uint *)((long)param + lVar13 * 0x10 + 0xb40);
        uVar17 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar16 + 0x8db),
                                *(undefined2 *)((long)param + lVar16 + 0x8d9));
        dVar33 = *(double *)((long)param + lVar13 * 8 + 0x880);
        dVar29 = *(double *)((long)param + (ulong)bVar21 * 8 + 8);
        dVar2 = *(double *)((long)param + (ulong)(0xe - uVar20) * 8 + 0x808);
        dVar3 = *(double *)((long)param + (ulong)uVar20 * 8 + 0x808);
        dVar32 = *(double *)((long)param + (ulong)uVar11 * 8 + 8) * dVar33 * 0.5;
        uVar5 = *(ushort *)((long)param + lVar16 + 0x8df);
        uVar6 = *(ushort *)((long)param + 0xb18);
        uVar11 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar16 + 0x8e7),
                                *(undefined2 *)((long)param + lVar16 + 0x8e5));
        bVar21 = *(byte *)((long)param + lVar13 * 2 + 0xad9);
        bVar19 = bVar21 & 0x20;
        uVar20 = -uVar17;
        if (bVar19 == 0) {
          uVar20 = uVar17;
        }
        uVar17 = (uint)(bVar19 >> 5);
        iVar22 = uVar17 * 0x20000 + -0x10000;
        uVar17 = -uVar17 | 1;
        bVar19 = (byte)(1 << ((byte)lVar13 & 0x1f));
        if (uVar11 == *puVar25) {
          uVar27 = puVar25[1];
          uVar18 = puVar25[2];
          uVar23 = puVar25[3];
          uVar26 = uVar27;
          uVar24 = uVar23;
          uVar15 = uVar18;
          switch(bVar21 >> 2 & 3) {
          case 0:
switchD_00159dac_caseD_0:
            uVar24 = uVar23;
            uVar20 = uVar26 + uVar20;
            do {
              uVar27 = uVar20;
              uVar15 = uVar18;
              if (uVar27 < 0x10000) goto switchD_00159dac_caseD_3;
              uVar11 = uVar11 + uVar17;
              bVar21 = *(byte *)(*(long *)((long)param + 0xb30) +
                                (ulong)(*(uint *)((long)param + 0xb3c) & uVar11));
              uVar24 = uVar18;
              if (bVar21 == 0x80) {
                if ((*(byte *)((long)param + lVar13 * 2 + 0xada) & 1) == 0) break;
                uVar11 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar16 + 0x8e3),
                                        *(undefined2 *)((long)param + lVar16 + 0x8e1));
                bVar21 = *(byte *)(*(long *)((long)param + 0xb30) +
                                  (ulong)(*(uint *)((long)param + 0xb3c) & uVar11));
              }
              uVar18 = (int)(short)((ushort)bVar21 << 8);
              uVar20 = uVar27 + iVar22;
            } while (bVar21 != 0x80);
            uVar27 = uVar27 + iVar22;
            uVar15 = 0;
            if (-1 < *(char *)((long)param + 0xb08)) {
              *(byte *)((long)param + 0xb05) = bVar4 & ~bVar19;
            }
            break;
          case 1:
switchD_00159dac_caseD_1:
            uVar20 = uVar26 + uVar20;
            do {
              uVar27 = uVar20;
              uVar15 = uVar18;
              if (uVar27 < 0x10000) goto switchD_00159dac_caseD_3;
              uVar20 = uVar11 + uVar17 * 2;
              lVar9 = *(long *)((long)param + 0xb30);
              uVar23 = *(uint *)((long)param + 0xb3c);
              sVar14 = CONCAT11(*(undefined1 *)(lVar9 + (ulong)(uVar11 + uVar17 * 2 + 1 & uVar23)),
                                *(undefined1 *)(lVar9 + (ulong)(uVar23 & uVar20)));
              uVar11 = uVar20;
              uVar24 = uVar18;
              if (sVar14 == -0x8000) {
                if ((*(byte *)((long)param + lVar13 * 2 + 0xada) & 1) == 0) break;
                uVar7 = *(ushort *)((long)param + lVar16 + 0x8e1);
                bVar21 = *(byte *)((long)param + lVar16 + 0x8e3);
                uVar11 = (uint)bVar21 * 0x10000 + (uint)uVar7;
                sVar14 = CONCAT11(*(undefined1 *)
                                   (lVar9 + (ulong)(CONCAT12(bVar21,uVar7) + 1 & uVar23)),
                                  *(undefined1 *)(lVar9 + (ulong)(uVar11 & uVar23)));
              }
              uVar18 = (int)sVar14;
              uVar20 = uVar27 + iVar22;
            } while (sVar14 != -0x8000);
            uVar27 = uVar27 + iVar22;
            uVar15 = 0;
            if (-1 < *(char *)((long)param + 0xb08)) {
              *(byte *)((long)param + 0xb05) = bVar4 & ~bVar19;
            }
            break;
          case 2:
switchD_00159dac_caseD_2:
            uVar11 = ((uVar26 & 0x8000) >> 0xf) + uVar11 * 2;
            uVar27 = uVar26 * 2 & 0xffff;
            if ((uVar26 & 0x8000) == 0) {
              uVar27 = uVar26 * 2;
            }
            for (uVar27 = uVar27 + uVar20; uVar15 = uVar18, 0xffff < uVar27;
                uVar27 = uVar27 + iVar22) {
              uVar11 = uVar11 + uVar17;
              bVar21 = *(byte *)(*(long *)((long)param + 0xb30) +
                                (ulong)(uVar11 >> 1 & *(uint *)((long)param + 0xb3c)));
              uVar24 = uVar18;
              if (bVar21 == 0x88) {
                if ((*(byte *)((long)param + lVar13 * 2 + 0xada) & 1) != 0) {
                  uVar11 = (uint)*(byte *)((long)param + lVar16 + 0x8e3) * 0x20000 +
                           (uint)*(ushort *)((long)param + lVar16 + 0x8e1) * 2;
                  bVar21 = *(byte *)(*(long *)((long)param + 0xb30) +
                                    (ulong)(*(uint *)((long)param + 0xb3c) & uVar11 >> 1));
                  if (bVar21 != 0x88) goto LAB_00159fe8;
                }
                uVar27 = uVar27 + iVar22;
                uVar15 = 0;
                if (-1 < *(char *)((long)param + 0xb08)) {
                  *(byte *)((long)param + 0xb05) = bVar4 & ~bVar19;
                }
                break;
              }
LAB_00159fe8:
              uVar20 = bVar21 & 0xf;
              if ((uVar11 & 1) != 0) {
                uVar20 = (uint)(bVar21 >> 4);
              }
              uVar18 = (int)k054539_update::dpcm[uVar20] + uVar18;
              if (0x7ffe < (int)uVar18) {
                uVar18 = 0x7fff;
              }
              if ((int)uVar18 < -0x7fff) {
                uVar18 = 0xffff8000;
              }
            }
            uVar27 = (uVar11 & 1) << 0xf | (int)uVar27 >> 1;
            uVar11 = uVar11 >> 1;
          }
        }
        else {
          *puVar25 = uVar11;
          uVar24 = 0;
          uVar23 = 0;
          uVar18 = 0;
          uVar26 = 0;
          uVar27 = 0;
          uVar15 = 0;
          switch(*(byte *)((long)param + lVar13 * 2 + 0xad9) >> 2 & 3) {
          case 0:
            goto switchD_00159dac_caseD_0;
          case 1:
            goto switchD_00159dac_caseD_1;
          case 2:
            goto switchD_00159dac_caseD_2;
          }
        }
switchD_00159dac_caseD_3:
        auVar31._8_8_ = dVar33 * dVar29 * dVar3;
        auVar31._0_8_ = dVar33 * dVar29 * dVar2;
        auVar31 = minpd(auVar10,auVar31);
        dVar33 = 1.8;
        if (dVar32 <= 1.8) {
          dVar33 = dVar32;
        }
        dVar29 = (double)(int)uVar15;
        psVar1 = (short *)(lVar8 + (ulong)((uint)(uVar5 >> 3) + (uint)uVar6 * 2 & 0x1fff) * 2);
        *psVar1 = *psVar1 + (short)(int)(dVar33 * dVar29);
        dVar28 = dVar29 * auVar31._0_8_ + dVar28;
        dVar30 = dVar29 * auVar31._8_8_ + dVar30;
        *puVar25 = uVar11;
        puVar25[1] = uVar27;
        puVar25[3] = uVar24;
        puVar25[2] = uVar15;
        if (-1 < *(char *)((long)param + 0xb08)) {
          *(char *)((long)param + lVar16 + 0x8e5) = (char)uVar11;
          *(char *)((long)param + lVar16 + 0x8e6) = (char)(uVar11 >> 8);
          *(char *)((long)param + lVar16 + 0x8e7) = (char)(uVar11 >> 0x10);
        }
      }
    }
    *(ushort *)((long)param + 0xb18) = (short)*(undefined4 *)((long)param + 0xb18) + 1U & 0x1fff;
    (*outputs)[uVar12] = (int)dVar30;
    outputs[1][uVar12] = (int)dVar28;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static void k054539_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k054539_state *info = (k054539_state *)param;
#define VOL_CAP 1.80

	static const INT16 dpcm[16] = {
		0 * 0x100,     1 * 0x100,   4 * 0x100,   9 * 0x100,  16 * 0x100, 25 * 0x100, 36 * 0x100, 49 * 0x100,
		-64 * 0x100, -49 * 0x100, -36 * 0x100, -25 * 0x100, -16 * 0x100, -9 * 0x100, -4 * 0x100, -1 * 0x100
	};

	INT16 *rbase = (INT16 *)info->ram;
	UINT32 sample, ch;

	if(!(info->regs[0x22f] & 1))
	{
		memset(outputs[0], 0, samples*sizeof(*outputs[0]));
		memset(outputs[1], 0, samples*sizeof(*outputs[1]));
		return;
	}

	for(sample = 0; sample != samples; sample++) {
		double lval, rval;
		if(!(info->flags & K054539_DISABLE_REVERB))
			lval = rval = rbase[info->reverb_pos];
		else
			lval = rval = 0;
		rbase[info->reverb_pos] = 0;

		for(ch=0; ch<8; ch++)
			if(info->regs[0x22c] & (1<<ch) && ! info->Muted[ch]) {
				UINT8 *base1 = info->regs + 0x20*ch;
				UINT8 *base2 = info->regs + 0x200 + 0x2*ch;
				k054539_channel *chan = info->channels + ch;
				int delta, vol, bval, pan;
				double cur_gain, lvol, rvol, rbvol;
				UINT32 cur_pos;
				int rdelta, fdelta, pdelta;
				int cur_pfrac, cur_val, cur_pval;

				delta = base1[0x00] | (base1[0x01] << 8) | (base1[0x02] << 16);

				vol = base1[0x03];

				bval = vol + base1[0x04];
				if (bval > 255)
					bval = 255;

				pan = base1[0x05];
				// DJ Main: 81-87 right, 88 middle, 89-8f left
				if (pan >= 0x81 && pan <= 0x8f)
					pan -= 0x81;
				else if (pan >= 0x11 && pan <= 0x1f)
					pan -= 0x11;
				else
					pan = 0x18 - 0x11;

				cur_gain = info->gain[ch];

				lvol = info->voltab[vol] * info->pantab[pan] * cur_gain;
				if (lvol > VOL_CAP)
					lvol = VOL_CAP;

				rvol = info->voltab[vol] * info->pantab[0xe - pan] * cur_gain;
				if (rvol > VOL_CAP)
					rvol = VOL_CAP;

				rbvol= info->voltab[bval] * cur_gain / 2;
				if (rbvol > VOL_CAP)
					rbvol = VOL_CAP;

				rdelta = (base1[6] | (base1[7] << 8)) >> 3;
				rdelta = (rdelta + info->reverb_pos) & 0x3fff;

				cur_pos = base1[0x0c] | (base1[0x0d] << 8) | (base1[0x0e] << 16);

				if(base2[0] & 0x20) {
					delta = -delta;
					fdelta = +0x10000;
					pdelta = -1;
				} else {
					fdelta = -0x10000;
					pdelta = +1;
				}

				if(cur_pos != chan->pos) {
					chan->pos = cur_pos;
					cur_pfrac = 0;
					cur_val = 0;
					cur_pval = 0;
				} else {
					cur_pfrac = chan->pfrac;
					cur_val = chan->val;
					cur_pval = chan->pval;
				}

				switch(base2[0] & 0xc) {
				case 0x0: { // 8bit pcm
					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x4: { // 16bit pcm lsb first
					pdelta <<= 1;

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x8: { // 4bit dpcm
					cur_pos <<= 1;
					cur_pfrac <<= 1;
					if(cur_pfrac & 0x10000) {
						cur_pfrac &= 0xffff;
						cur_pos |= 1;
					}

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						if(cur_val == 0x88 && (base2[1] & 1)) {
							cur_pos = (base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16)) << 1;
							cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						}
						if(cur_val == 0x88) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
						if(cur_pos & 1)
							cur_val >>= 4;
						else
							cur_val &= 15;
						cur_val = cur_pval + dpcm[cur_val];
						if(cur_val < -32768)
							cur_val = -32768;
						else if(cur_val > 32767)
							cur_val = 32767;
					}

					cur_pfrac >>= 1;
					if(cur_pos & 1)
						cur_pfrac |= 0x8000;
					cur_pos >>= 1;
					break;
				}
				default:
					LOG(("Unknown sample type %x for channel %d\n", base2[0] & 0xc, ch));
					break;
				}
				lval += cur_val * lvol;
				rval += cur_val * rvol;
				rbase[(rdelta + info->reverb_pos) & 0x1fff] += (INT16)(cur_val*rbvol);

				chan->pos = cur_pos;
				chan->pfrac = cur_pfrac;
				chan->pval = cur_pval;
				chan->val = cur_val;

				if(k054539_regupdate(info)) {
					base1[0x0c] = cur_pos     & 0xff;
					base1[0x0d] = cur_pos>> 8 & 0xff;
					base1[0x0e] = cur_pos>>16 & 0xff;
				}
			}
		info->reverb_pos = (info->reverb_pos + 1) & 0x1fff;
		outputs[0][sample] = (DEV_SMPL)lval;
		outputs[1][sample] = (DEV_SMPL)rval;
	}
}